

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

treeNode * forStmt(void)

{
  bool bVar1;
  treeNode *ptVar2;
  treeNode *extraout_RAX;
  double __x;
  treeNode *local_180;
  allocator local_139;
  string local_138;
  allocator local_111;
  string local_110;
  allocator local_e9;
  string local_e8;
  allocator local_c1;
  string local_c0;
  allocator local_99;
  string local_98;
  undefined1 local_72;
  allocator local_71;
  string local_70;
  treeNode *local_50;
  treeNode *forExp;
  allocator local_31;
  string local_30;
  treeNode *local_10;
  treeNode *ret;
  
  ptVar2 = (treeNode *)operator_new(0x58);
  forExp._3_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"",&local_31);
  treeNode::treeNode(ptVar2,forRpt,&local_30);
  forExp._3_1_ = 0;
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  local_10 = ptVar2;
  ptVar2 = (treeNode *)operator_new(0x58);
  local_72 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"forExp",&local_71);
  treeNode::treeNode(ptVar2,forRpt,&local_70);
  local_72 = 0;
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  local_10->child[0] = ptVar2;
  local_50 = ptVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"for",&local_99);
  match(&local_98,Empty);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"(",&local_c1);
  match(&local_c0,Empty);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  ptVar2 = statement();
  local_50->child[0] = ptVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e8,";",&local_e9);
  match(&local_e8,lackSem);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  bVar1 = std::operator==(&nextToken.text,";");
  if (bVar1) {
    local_180 = (treeNode *)0x0;
  }
  else {
    exp(__x);
    local_180 = extraout_RAX;
  }
  local_50->child[1] = local_180;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_110,";",&local_111);
  match(&local_110,lackSem);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  ptVar2 = statement();
  local_50->child[2] = ptVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_138,")",&local_139);
  match(&local_138,lackRightBucket);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  ptVar2 = statementClosure();
  local_10->child[1] = ptVar2;
  return local_10;
}

Assistant:

treeNode* forStmt()
{
    auto ret = new treeNode(StmtKind::forRpt,"");
    auto forExp = new treeNode(StmtKind::forRpt,"forExp");
    ret->child[0]=forExp;
    match("for");
    match("(");
    forExp->child[0]=statement();
    match(";",Error::lackSem);
    forExp->child[1]=(nextToken.text==";"?nullptr:exp());
    match(";",Error::lackSem);
    forExp->child[2]=statement();
    match(")",Error::lackRightBucket);
    ret->child[1]=statementClosure();
    return ret;
}